

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Menu_.cxx
# Opt level: O1

int __thiscall Fl_Menu_::find_index(Fl_Menu_ *this,Fl_Callback *cb)

{
  long *plVar1;
  int iVar2;
  long lVar3;
  int t;
  long lVar4;
  long lVar5;
  
  lVar4 = 0;
  lVar5 = 0x10;
  while( true ) {
    if (this->menu_ == (Fl_Menu_Item *)0x0) {
      lVar3 = 0;
    }
    else {
      iVar2 = Fl_Menu_Item::size(this->menu_);
      lVar3 = (long)iVar2;
    }
    if (lVar3 <= lVar4) break;
    lVar4 = lVar4 + 1;
    plVar1 = (long *)((long)&this->menu_->text + lVar5);
    lVar5 = lVar5 + 0x38;
    if ((Fl_Callback *)*plVar1 == cb) {
      return (int)lVar4 + -1;
    }
  }
  return -1;
}

Assistant:

int Fl_Menu_::find_index(Fl_Callback *cb) const {
  for ( int t=0; t < size(); t++ )
    if (menu_[t].callback_==cb)
      return(t);
  return(-1);
}